

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O2

int run_test_process_title_threadsafe(void)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  undefined8 uStack_50;
  uv_thread_t getter_thread;
  uv_thread_t setter_threads [4];
  
  iVar1 = uv_set_process_title
                    ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled");
  if (iVar1 == 0) {
    iVar1 = uv_thread_create(&getter_thread,getter_thread_body,(void *)0x0);
    if (iVar1 == 0) {
      lVar2 = 0;
      do {
        if (lVar2 + 8 == 0x28) {
          lVar2 = 0;
          do {
            if (lVar2 + 8 == 0x28) {
              return 0;
            }
            iVar1 = uv_thread_join((uv_thread_t *)((long)setter_threads + lVar2));
            lVar2 = lVar2 + 8;
          } while (iVar1 == 0);
          pcVar3 = "0 == uv_thread_join(&setter_threads[i])";
          uStack_50 = 0x56;
          goto LAB_0014269a;
        }
        iVar1 = uv_thread_create((uv_thread_t *)((long)setter_threads + lVar2),setter_thread_body,
                                 (void *)0x0);
        lVar2 = lVar2 + 8;
      } while (iVar1 == 0);
      pcVar3 = "0 == uv_thread_create(&setter_threads[i], setter_thread_body, NULL)";
      uStack_50 = 0x53;
    }
    else {
      pcVar3 = "0 == uv_thread_create(&getter_thread, getter_thread_body, NULL)";
      uStack_50 = 0x50;
    }
  }
  else {
    pcVar3 = "0 == uv_set_process_title(titles[0])";
    uStack_50 = 0x4f;
  }
LAB_0014269a:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
          ,uStack_50,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(process_title_threadsafe) {
  uv_thread_t setter_threads[4];
  uv_thread_t getter_thread;
  int i;

#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__MVS__) || defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  ASSERT(0 == uv_set_process_title(titles[0]));
  ASSERT(0 == uv_thread_create(&getter_thread, getter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT(0 == uv_thread_create(&setter_threads[i], setter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT(0 == uv_thread_join(&setter_threads[i]));

  return 0;
}